

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vad_sp.c
# Opt level: O3

int16_t WebRtcVad_FindMinimum(VadInstT *self,int16_t feature_value,int channel)

{
  undefined2 uVar1;
  int16_t iVar2;
  int iVar3;
  uint uVar5;
  short sVar6;
  long lVar7;
  int16_t *piVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int16_t *piVar4;
  
  if (5 < channel) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/common_audio/vad/vad_sp.c"
            ,0x49,"DCHECK failed: (channel) < (kNumChannels)");
    exit(1);
  }
  lVar7 = (long)(channel << 4);
  piVar4 = self->low_value_vector + lVar7;
  piVar8 = self->low_value_vector + lVar7 + 1;
  lVar9 = 1;
  uVar11 = 0;
  do {
    uVar10 = 0xe;
    if (0xe < uVar11) {
      uVar10 = uVar11;
    }
    if (self->index_vector[lVar7 + uVar11] == 100) {
      if (uVar11 != 0xf) {
        lVar12 = 0;
        do {
          piVar8[lVar12 + -1] = piVar8[lVar12];
          piVar8[lVar12 + -0x61] = piVar8[lVar12 + -0x60];
          lVar12 = lVar12 + 1;
        } while (uVar10 + lVar9 != lVar12);
      }
      self->index_vector[lVar7 + 0xf] = 0x65;
      self->low_value_vector[lVar7 + 0xf] = 10000;
    }
    else {
      self->index_vector[lVar7 + uVar11] = self->index_vector[lVar7 + uVar11] + 1;
    }
    uVar11 = uVar11 + 1;
    piVar8 = piVar8 + 1;
    lVar9 = lVar9 + -1;
  } while (uVar11 != 0x10);
  if (feature_value < self->low_value_vector[lVar7 + 7]) {
    if (feature_value < self->low_value_vector[lVar7 + 3]) {
      if (feature_value < self->low_value_vector[lVar7 + 1]) {
        uVar11 = (ulong)(*piVar4 <= feature_value);
      }
      else {
        uVar11 = (ulong)(feature_value < self->low_value_vector[lVar7 + 2]) ^ 3;
      }
    }
    else if (feature_value < self->low_value_vector[lVar7 + 5]) {
      uVar11 = (ulong)(feature_value < self->low_value_vector[lVar7 + 4]) ^ 5;
    }
    else {
      uVar11 = (ulong)(feature_value < self->low_value_vector[lVar7 + 6]) ^ 7;
    }
    goto LAB_001214a1;
  }
  if (feature_value < self->low_value_vector[lVar7 + 0xf]) {
    if (feature_value < self->low_value_vector[lVar7 + 0xb]) {
      if (feature_value < self->low_value_vector[lVar7 + 9]) {
        uVar11 = (ulong)(feature_value < self->low_value_vector[lVar7 + 8]) ^ 9;
      }
      else {
        uVar11 = (ulong)(feature_value < self->low_value_vector[lVar7 + 10]) ^ 0xb;
      }
LAB_001214a1:
      lVar9 = 0xfd;
      do {
        uVar1 = *(undefined2 *)((long)self + lVar9 * 2 + lVar7 * 2 + -0xc2);
        *(undefined2 *)((long)self->downsampling_filter_states + lVar9 * 2 + lVar7 * 2 + -4) =
             *(undefined2 *)((long)self->downsampling_filter_states + lVar9 * 2 + lVar7 * 2 + -6);
        *(undefined2 *)((long)self + lVar9 * 2 + lVar7 * 2 + -0xc0) = uVar1;
        uVar10 = lVar9 - 0xef;
        lVar9 = lVar9 + -1;
      } while (uVar11 < uVar10);
      iVar3 = (int)uVar11;
    }
    else {
      if (feature_value < self->low_value_vector[lVar7 + 0xd]) {
        uVar11 = (ulong)(feature_value < self->low_value_vector[lVar7 + 0xc]) ^ 0xd;
        goto LAB_001214a1;
      }
      iVar3 = 0xf;
      uVar11 = 0xe;
      if (feature_value < self->low_value_vector[lVar7 + 0xe]) goto LAB_001214a1;
    }
    *(int16_t *)((long)piVar4 + (ulong)(uint)(iVar3 * 2)) = feature_value;
    *(undefined2 *)((long)self->index_vector + (ulong)(uint)(iVar3 * 2) + lVar7 * 2) = 1;
  }
  if (self->frame_counter < 3) {
    if (self->frame_counter < 1) {
      sVar6 = self->mean_value[channel];
      uVar5 = 0;
      iVar3 = 0x640;
      goto LAB_00121522;
    }
  }
  else {
    piVar4 = self->low_value_vector + lVar7 + 2;
  }
  iVar3 = (int)*piVar4;
  sVar6 = self->mean_value[channel];
  uVar5 = 0x7eb7;
  if (*piVar4 < sVar6) {
    uVar5 = 0x1999;
  }
LAB_00121522:
  iVar2 = (int16_t)((uVar5 ^ 0x7fff) * iVar3 + (int)sVar6 * (uVar5 + 1) + 0x4000 >> 0xf);
  self->mean_value[channel] = iVar2;
  return iVar2;
}

Assistant:

int16_t WebRtcVad_FindMinimum(VadInstT* self,
                              int16_t feature_value,
                              int channel) {
  int i = 0, j = 0;
  int position = -1;
  // Offset to beginning of the 16 minimum values in memory.
  const int offset = (channel << 4);
  int16_t current_median = 1600;
  int16_t alpha = 0;
  int32_t tmp32 = 0;
  // Pointer to memory for the 16 minimum values and the age of each value of
  // the `channel`.
  int16_t* age = &self->index_vector[offset];
  int16_t* smallest_values = &self->low_value_vector[offset];

  RTC_DCHECK_LT(channel, kNumChannels);

  // Each value in `smallest_values` is getting 1 loop older. Update `age`, and
  // remove old values.
  for (i = 0; i < 16; i++) {
    if (age[i] != 100) {
      age[i]++;
    } else {
      // Too old value. Remove from memory and shift larger values downwards.
      for (j = i; j < 15; j++) {
        smallest_values[j] = smallest_values[j + 1];
        age[j] = age[j + 1];
      }
      age[15] = 101;
      smallest_values[15] = 10000;
    }
  }

  // Check if `feature_value` is smaller than any of the values in
  // `smallest_values`. If so, find the `position` where to insert the new value
  // (`feature_value`).
  if (feature_value < smallest_values[7]) {
    if (feature_value < smallest_values[3]) {
      if (feature_value < smallest_values[1]) {
        if (feature_value < smallest_values[0]) {
          position = 0;
        } else {
          position = 1;
        }
      } else if (feature_value < smallest_values[2]) {
        position = 2;
      } else {
        position = 3;
      }
    } else if (feature_value < smallest_values[5]) {
      if (feature_value < smallest_values[4]) {
        position = 4;
      } else {
        position = 5;
      }
    } else if (feature_value < smallest_values[6]) {
      position = 6;
    } else {
      position = 7;
    }
  } else if (feature_value < smallest_values[15]) {
    if (feature_value < smallest_values[11]) {
      if (feature_value < smallest_values[9]) {
        if (feature_value < smallest_values[8]) {
          position = 8;
        } else {
          position = 9;
        }
      } else if (feature_value < smallest_values[10]) {
        position = 10;
      } else {
        position = 11;
      }
    } else if (feature_value < smallest_values[13]) {
      if (feature_value < smallest_values[12]) {
        position = 12;
      } else {
        position = 13;
      }
    } else if (feature_value < smallest_values[14]) {
      position = 14;
    } else {
      position = 15;
    }
  }

  // If we have detected a new small value, insert it at the correct position
  // and shift larger values up.
  if (position > -1) {
    for (i = 15; i > position; i--) {
      smallest_values[i] = smallest_values[i - 1];
      age[i] = age[i - 1];
    }
    smallest_values[position] = feature_value;
    age[position] = 1;
  }

  // Get `current_median`.
  if (self->frame_counter > 2) {
    current_median = smallest_values[2];
  } else if (self->frame_counter > 0) {
    current_median = smallest_values[0];
  }

  // Smooth the median value.
  if (self->frame_counter > 0) {
    if (current_median < self->mean_value[channel]) {
      alpha = kSmoothingDown;  // 0.2 in Q15.
    } else {
      alpha = kSmoothingUp;  // 0.99 in Q15.
    }
  }
  tmp32 = (alpha + 1) * self->mean_value[channel];
  tmp32 += (WEBRTC_SPL_WORD16_MAX - alpha) * current_median;
  tmp32 += 16384;
  self->mean_value[channel] = (int16_t) (tmp32 >> 15);

  return self->mean_value[channel];
}